

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerServer.cpp
# Opt level: O1

void __thiscall helics::apps::BrokerServer::BrokerServer(BrokerServer *this,int argc,char **argv)

{
  pointer pcVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> app;
  int local_9c [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [32];
  
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->servers).
  super__Vector_base<std::shared_ptr<helics::apps::TypedBrokerServer>,_std::allocator<std::shared_ptr<helics::apps::TypedBrokerServer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68 = &(this->configFile_).field_2;
  this->zmq_server = false;
  this->zmq_ss_server = false;
  this->tcp_server = false;
  this->udp_server = false;
  this->udp_server = false;
  this->http_server = false;
  this->websocket_server = false;
  this->exitall = (__atomic_base<bool>)0x0;
  (this->configFile_)._M_dataplus._M_p = (pointer)local_68;
  (this->configFile_)._M_string_length = 0;
  (this->configFile_).field_2._M_local_buf[0] = '\0';
  local_9c[0] = argc;
  local_50._24_8_ = argv;
  gmlc::utilities::randomString_abi_cxx11_(0x1bf472);
  pbVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                  "_broker_server");
  local_70 = &(this->server_name_).field_2;
  (this->server_name_)._M_dataplus._M_p = (pointer)local_70;
  pcVar1 = (pbVar3->_M_dataplus)._M_p;
  paVar4 = &pbVar3->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == paVar4) {
    uVar2 = *(undefined8 *)((long)&pbVar3->field_2 + 8);
    local_70->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->server_name_).field_2 + 8) = uVar2;
  }
  else {
    (this->server_name_)._M_dataplus._M_p = pcVar1;
    (this->server_name_).field_2._M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->server_name_)._M_string_length = pbVar3->_M_string_length;
  (pbVar3->_M_dataplus)._M_p = (pointer)paVar4;
  pbVar3->_M_string_length = 0;
  (pbVar3->field_2)._M_local_buf[0] = '\0';
  if ((helicsCLI11App *)local_60._0_8_ != (helicsCLI11App *)local_50) {
    operator_delete((void *)local_60._0_8_,local_50._0_8_ + 1);
  }
  local_50._16_8_ = &this->config_;
  (this->config_)._M_t.
  super___uniq_ptr_impl<helics::fileops::JsonStorage,_std::default_delete<helics::fileops::JsonStorage>_>
  ._M_t.
  super__Tuple_impl<0UL,_helics::fileops::JsonStorage_*,_std::default_delete<helics::fileops::JsonStorage>_>
  .super__Head_base<0UL,_helics::fileops::JsonStorage_*,_false>._M_head_impl = (JsonStorage *)0x0;
  local_78 = &(this->mHttpArgs).field_2;
  (this->mHttpArgs)._M_dataplus._M_p = (pointer)local_78;
  (this->mHttpArgs)._M_string_length = 0;
  (this->mHttpArgs).field_2._M_local_buf[0] = '\0';
  (this->mWebSocketArgs)._M_dataplus._M_p = (pointer)&(this->mWebSocketArgs).field_2;
  (this->mWebSocketArgs)._M_string_length = 0;
  (this->mWebSocketArgs).field_2._M_local_buf[0] = '\0';
  (this->mZmqArgs)._M_dataplus._M_p = (pointer)&(this->mZmqArgs).field_2;
  (this->mZmqArgs)._M_string_length = 0;
  (this->mZmqArgs).field_2._M_local_buf[0] = '\0';
  (this->mTcpArgs)._M_dataplus._M_p = (pointer)&(this->mTcpArgs).field_2;
  (this->mTcpArgs)._M_string_length = 0;
  (this->mTcpArgs).field_2._M_local_buf[0] = '\0';
  (this->mUdpArgs)._M_dataplus._M_p = (pointer)&(this->mUdpArgs).field_2;
  (this->mUdpArgs)._M_string_length = 0;
  (this->mUdpArgs).field_2._M_local_buf[0] = '\0';
  (this->mMpiArgs)._M_dataplus._M_p = (pointer)&(this->mMpiArgs).field_2;
  (this->mMpiArgs)._M_string_length = 0;
  (this->mMpiArgs).field_2._M_local_buf[0] = '\0';
  generateArgProcessing((BrokerServer *)local_60);
  helicsCLI11App::helics_parse<int&,char**&>
            ((helicsCLI11App *)local_60._0_8_,local_9c,(char ***)(local_50 + 0x18));
  if ((helicsCLI11App *)local_60._0_8_ != (helicsCLI11App *)0x0) {
    (**(code **)(*(long *)local_60._0_8_ + 8))();
  }
  return;
}

Assistant:

BrokerServer::BrokerServer(int argc, char* argv[]):
    server_name_{gmlc::utilities::randomString(5) + "_broker_server"}
{
    auto app = generateArgProcessing();
    app->helics_parse(argc, argv);
}